

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2i.c
# Opt level: O2

void * Int2_ManReadInterpolant(sat_solver2 *pSat)

{
  Gia_Man_t *p;
  ulong uVar1;
  Vec_Int_t *p_00;
  int iVar2;
  int iVar3;
  int iVar4;
  Gia_Obj_t *pGVar5;
  Gia_Man_t *pGVar6;
  
  p = pSat->pInt2->pGia;
  pSat->pInt2->pGia = (Gia_Man_t *)0x0;
  iVar4 = pSat->hProofLast;
  if (iVar4 == -1) {
    return (void *)0x0;
  }
  if (p->vCos->nSize == p->nRegs) {
    if ((-1 < iVar4) && (iVar2 = Abc_Lit2Var(iVar4), iVar2 < p->nObjs)) {
      iVar2 = Abc_Lit2Var(iVar4);
      pGVar5 = Gia_ManObj(p,iVar2);
      if ((~*(uint *)pGVar5 & 0x1fffffff) == 0 || -1 < (int)*(uint *)pGVar5) {
        pGVar5 = Gia_ManAppendObj(p);
        pGVar5->field_0x3 = pGVar5->field_0x3 | 0x80;
        iVar2 = Gia_ObjId(p,pGVar5);
        iVar3 = Abc_Lit2Var(iVar4);
        *(ulong *)pGVar5 =
             *(ulong *)pGVar5 & 0xffffffffe0000000 | (ulong)(iVar2 - iVar3 & 0x1fffffff);
        iVar4 = Abc_LitIsCompl(iVar4);
        uVar1 = *(ulong *)pGVar5;
        *(ulong *)pGVar5 = uVar1 & 0xffffffffdfffffff | (ulong)(uint)(iVar4 << 0x1d);
        *(ulong *)pGVar5 =
             uVar1 & 0xe0000000dfffffff | (ulong)(uint)(iVar4 << 0x1d) |
             (ulong)(p->vCos->nSize & 0x1fffffff) << 0x20;
        p_00 = p->vCos;
        iVar4 = Gia_ObjId(p,pGVar5);
        Vec_IntPush(p_00,iVar4);
        if (p->pFanData != (int *)0x0) {
          Gia_ObjAddFanout(p,pGVar5 + -(ulong)((uint)*(undefined8 *)pGVar5 & 0x1fffffff),pGVar5);
        }
        Gia_ObjId(p,pGVar5);
        pSat->hProofLast = -1;
        pGVar6 = Gia_ManCleanup(p);
        Gia_ManStop(p);
        return pGVar6;
      }
      __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                    ,0x2ed,"int Gia_ManAppendCo(Gia_Man_t *, int)");
    }
    __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x2ec,"int Gia_ManAppendCo(Gia_Man_t *, int)");
  }
  __assert_fail("Gia_ManPoNum(pGia) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2i.c"
                ,0x58,"void *Int2_ManReadInterpolant(sat_solver2 *)");
}

Assistant:

void * Int2_ManReadInterpolant( sat_solver2 * pSat )
{
    Int2_Man_t * p = pSat->pInt2;
    Gia_Man_t * pTemp, * pGia = p->pGia; p->pGia = NULL;
    // return NULL, if the interpolant is not ready (for example, when the solver returned 'sat')
    if ( pSat->hProofLast == -1 )
        return NULL;
    // create AIG with one primary output
    assert( Gia_ManPoNum(pGia) == 0 );
    Gia_ManAppendCo( pGia, pSat->hProofLast );  
    pSat->hProofLast = -1;
    // cleanup the resulting AIG
    pGia = Gia_ManCleanup( pTemp = pGia );
    Gia_ManStop( pTemp );
    return (void *)pGia;
}